

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O0

void __thiscall wasm::ReFinalize::updateBreakValueType(ReFinalize *this,Name name,Type type)

{
  bool bVar1;
  mapped_type *this_00;
  BasicType local_2c;
  ReFinalize *local_28;
  ReFinalize *this_local;
  Type type_local;
  Name name_local;
  
  type_local.id = name.super_IString.str._M_len;
  local_2c = unreachable;
  local_28 = this;
  this_local = (ReFinalize *)type.id;
  bVar1 = wasm::Type::operator!=((Type *)&this_local,&local_2c);
  if (bVar1) {
    this_00 = std::
              unordered_map<wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
              ::operator[](&this->breakTypes,(key_type *)&type_local);
    std::
    unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
    ::insert(this_00,(value_type *)&this_local);
  }
  return;
}

Assistant:

void ReFinalize::updateBreakValueType(Name name, Type type) {
  if (type != Type::unreachable) {
    breakTypes[name].insert(type);
  }
}